

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O2

void err_msg_system(err_lvl_t lvl,char *path,long ln,char *fmt,...)

{
  int __errnum;
  err_cb_f p_Var1;
  void *pvVar2;
  char in_AL;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_4e8 [32];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char msg [1024];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  piVar3 = __errno_location();
  if (err_cb != (err_cb_f)0x0) {
    __errnum = *piVar3;
    ap[0].reg_save_area = local_4e8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x20;
    ap[0].fp_offset = 0x30;
    pcVar5 = msg;
    vsnprintf(pcVar5,0x400,fmt,ap);
    pvVar2 = err_user_data;
    p_Var1 = err_cb;
    if (path == (char *)0x0) {
      pcVar5 = strerror(__errnum);
      (*p_Var1)(pvVar2,lvl,"%s: %s\n",msg,pcVar5);
    }
    else {
      pcVar4 = path2basename(path);
      pvVar2 = err_user_data;
      p_Var1 = err_cb;
      if (lvl == ERR_INFO) {
        strerror(__errnum);
        pcVar7 = "%s: %s(%ld): %s: %s\n";
        pcVar6 = "INFO";
        lvl = ERR_INFO;
      }
      else if (lvl == ERR_INFOCONT) {
        pcVar5 = strerror(__errnum);
        pcVar7 = "%s(%ld): %s: %s\n";
        lvl = ERR_INFOCONT;
        pcVar6 = pcVar4;
        pcVar4 = (char *)ln;
        ln = (long)msg;
      }
      else {
        pcVar6 = err_msg::err_prefix[lvl];
        strerror(__errnum);
        pcVar7 = "%s: \"%s\", line %ld: %s: %s\n";
      }
      (*p_Var1)(pvVar2,lvl,pcVar7,pcVar6,pcVar4,ln,pcVar5);
    }
  }
  return;
}

Assistant:

void
err_msg_system(err_lvl_t lvl, const char *path, long ln, const char *fmt, ...)
{
    int local_errno = errno;
    
    static const char *err_prefix[ERR_MAX] = {
        "DEBUG", "INFO", "INFOCONT", "WARN", "ERROR", "FATAL"
    };

    char msg[1024];
    va_list ap;

    if (!err_cb)
        return;

    va_start(ap, fmt);
    vsnprintf(msg, sizeof(msg), fmt, ap);
    va_end(ap);

    if (path) {
        const char *fname = path2basename(path);
        if (lvl == ERR_INFOCONT)
    	    err_cb(err_user_data, lvl, "%s(%ld): %s: %s\n", fname, ln, msg, strerror(local_errno));
        else if (lvl == ERR_INFO)
            err_cb(err_user_data, lvl, "%s: %s(%ld): %s: %s\n", err_prefix[lvl], fname, ln, msg, strerror(local_errno));
        else
    	    err_cb(err_user_data, lvl, "%s: \"%s\", line %ld: %s: %s\n", err_prefix[lvl], fname, ln, msg, strerror(local_errno));
    } else {
        err_cb(err_user_data, lvl, "%s: %s\n", msg, strerror(local_errno));
    }
}